

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O2

void __thiscall
Shell::PlainALManager::recordSkolemBinding(PlainALManager *this,Term *skT,uint var,string *vName)

{
  undefined1 local_38 [40];
  
  local_38._0_8_ = skT;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)vName);
  Lib::
  Stack<std::pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push(&this->_skolemNames,
         (pair<Kernel::Term_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void PlainALManager::recordSkolemBinding(Term* skT,unsigned var,std::string vName)
{
  _skolemNames.push(std::make_pair(skT,vName));
}